

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode.c
# Opt level: O0

int arkHandleFailure(ARKodeMem ark_mem,int flag)

{
  int in_ESI;
  ARKodeMem in_RDI;
  int local_4;
  
  local_4 = in_ESI;
  switch(in_ESI) {
  case -0x37:
    arkProcessError(in_RDI,-0x37,0xb4b,"arkHandleFailure",
                    "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode.c"
                    ,"A SUNAdjStepper operation failed unrecoverably");
    break;
  case -0x36:
    arkProcessError(in_RDI,-0x36,0xb43,"arkHandleFailure",
                    "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode.c"
                    ,"The forward recomputation of step failed unrecoverably");
    break;
  case -0x35:
    arkProcessError(in_RDI,-0x35,0xb47,"arkHandleFailure",
                    "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode.c"
                    ,"A checkpoint operation failed unrecoverably");
    break;
  default:
    arkProcessError(in_RDI,-99,0xb5c,"arkHandleFailure",
                    "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode.c"
                    ,
                    "ARKODE encountered an unrecognized error. Please report this to the Sundials developers at sundials-users@llnl.gov"
                   );
    local_4 = -99;
    break;
  case -0x33:
    arkProcessError(in_RDI,-0x33,0xb57,"arkHandleFailure",
                    "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode.c"
                    ,"An inner SUNStepper error occurred");
    break;
  case -0x32:
    arkProcessError(in_RDI,-0x32,0xb53,"arkHandleFailure",
                    "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode.c"
                    ,"The max stage limit failed unrecoverably");
    break;
  case -0x31:
    arkProcessError(in_RDI,-0x31,0xb4f,"arkHandleFailure",
                    "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode.c"
                    ,"The dominant eigenvalue function failed unrecoverably");
    break;
  case -0x2e:
    arkProcessError(in_RDI,-0x2e,0xb3f,"arkHandleFailure",
                    "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode.c"
                    ,"The relaxation Jacobian failed unrecoverably");
    break;
  case -0x2d:
    arkProcessError(in_RDI,-0x2d,0xb3b,"arkHandleFailure",
                    "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode.c"
                    ,"The relaxation function failed unrecoverably");
    break;
  case -0x2c:
    arkProcessError(in_RDI,-0x2c,0xb37,"arkHandleFailure",
                    "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode.c"
                    ,"The ARKODE relaxation module memory is NULL");
    break;
  case -0x2b:
    arkProcessError((ARKodeMem)in_RDI->tcur,(int)in_RDI,-0x2b,(char *)0xb32,"arkHandleFailure",
                    "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode.c"
                    ,"At t = %.15g the relaxation module failed");
    break;
  case -0x29:
    arkProcessError(in_RDI,-0x29,0xb2e,"arkHandleFailure",
                    "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode.c"
                    ,"ARKODE was provided an invalid method table");
    break;
  case -0x28:
    arkProcessError((ARKodeMem)in_RDI->tcur,(int)in_RDI,-0x28,(char *)0xb28,"arkHandleFailure",
                    "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode.c"
                    ,"At t = %.15g the interpolation module failed unrecoverably");
    break;
  case -0x27:
    arkProcessError((ARKodeMem)in_RDI->tcur,(int)in_RDI,-0x27,(char *)0xb1c,"arkHandleFailure",
                    "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode.c"
                    ,"At t = %.15g the user-supplied predictor failed in an unrecoverable manner.");
    break;
  case -0x26:
    arkProcessError((ARKodeMem)in_RDI->tcur,(int)in_RDI,-0x26,(char *)0xb24,"arkHandleFailure",
                    "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode.c"
                    ,
                    "At t = %.15g, the stage postprocessing routine failed in an unrecoverable manner."
                   );
    break;
  case -0x25:
    arkProcessError((ARKodeMem)in_RDI->tcur,(int)in_RDI,-0x25,(char *)0xb20,"arkHandleFailure",
                    "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode.c"
                    ,
                    "At t = %.15g, the step postprocessing routine failed in an unrecoverable manner."
                   );
    break;
  case -0x22:
    arkProcessError((ARKodeMem)in_RDI->tcur,(int)in_RDI,-0x22,(char *)0xb14,"arkHandleFailure",
                    "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode.c"
                    ,"At t = %.15g, the inner stepper failed in an unrecoverable manner.");
    break;
  case -0x20:
    arkProcessError((ARKodeMem)in_RDI->tcur,(int)in_RDI,-0x20,(char *)0xb18,"arkHandleFailure",
                    "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode.c"
                    ,"At t = %.15g the nonlinear solver failed in an unrecoverable manner.");
    break;
  case -0x1e:
    arkProcessError((ARKodeMem)in_RDI->tcur,(int)in_RDI,-0x1e,(char *)0xb0a,"arkHandleFailure",
                    "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode.c"
                    ,"At t = %.15g the nonlinear solver setup failed unrecoverably");
    break;
  case -0x1c:
    arkProcessError((ARKodeMem)in_RDI->tcur,(int)in_RDI,-0x1c,(char *)0xb10,"arkHandleFailure",
                    "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode.c"
                    ,"At t = %.15g, a vector operation failed.");
    break;
  case -0x1b:
    arkProcessError(in_RDI,-0x1b,0xafe,"arkHandleFailure",
                    "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode.c"
                    ,"tout too close to t0 to start integration.");
    break;
  case -0x13:
    arkProcessError((ARKodeMem)in_RDI->tcur,(int)in_RDI,-0x13,(char *)0xb02,"arkHandleFailure",
                    "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode.c"
                    ,"At t = %.15g, unable to satisfy inequality constraints.");
    break;
  case -0x10:
    arkProcessError(in_RDI,-0x10,0xb06,"arkHandleFailure",
                    "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode.c"
                    ,"The mass matrix solver failed.");
    break;
  case -0xc:
    arkProcessError((ARKodeMem)in_RDI->tcur,(int)in_RDI,-0xc,(char *)0xafa,"arkHandleFailure",
                    "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode.c"
                    ,"At t = %.15g, the rootfinding routine failed in an unrecoverable manner.");
    break;
  case -0xb:
    arkProcessError((ARKodeMem)in_RDI->tcur,(int)in_RDI,-0xb,(char *)0xaf2,"arkHandleFailure",
                    "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode.c"
                    ,
                    "At t = %.15g, the right-hand side failed in a recoverable manner, but no recovery is possible."
                   );
    break;
  case -10:
    arkProcessError((ARKodeMem)in_RDI->tcur,(int)in_RDI,-10,(char *)0xaf6,"arkHandleFailure",
                    "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode.c"
                    ,"At t = %.15g repeated recoverable right-hand side function errors.");
    break;
  case -8:
    arkProcessError((ARKodeMem)in_RDI->tcur,(int)in_RDI,-8,(char *)0xaee,"arkHandleFailure",
                    "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode.c"
                    ,"At t = %.15g, the right-hand side routine failed in an unrecoverable manner.")
    ;
    break;
  case -7:
    arkProcessError((ARKodeMem)in_RDI->tcur,(int)in_RDI,-7,(char *)0xaea,"arkHandleFailure",
                    "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode.c"
                    ,"At t = %.15g, the solve routine failed in an unrecoverable manner.");
    break;
  case -6:
    arkProcessError((ARKodeMem)in_RDI->tcur,(int)in_RDI,-6,(char *)0xae6,"arkHandleFailure",
                    "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode.c"
                    ,"At t = %.15g, the setup routine failed in an unrecoverable manner.");
    break;
  case -4:
    arkProcessError((ARKodeMem)in_RDI->tcur,(int)in_RDI->h,(int)in_RDI,(char *)0xfffffffc,
                    (char *)0xae2,"arkHandleFailure",
                    "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode.c"
                    ,
                    "At t = %.15g and h = %.15g, the solver convergence test failed repeatedly or with |h| = hmin."
                   );
    break;
  case -3:
    arkProcessError((ARKodeMem)in_RDI->tcur,(int)in_RDI->h,(int)in_RDI,(char *)0xfffffffd,
                    (char *)0xade,"arkHandleFailure",
                    "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode.c"
                    ,
                    "At t = %.15g and h = %.15g, the error test failed repeatedly or with |h| = hmin."
                   );
  }
  return local_4;
}

Assistant:

int arkHandleFailure(ARKodeMem ark_mem, int flag)
{
  /* Depending on flag, print error message and return error flag */
  switch (flag)
  {
  case ARK_ERR_FAILURE:
    arkProcessError(ark_mem, ARK_ERR_FAILURE, __LINE__, __func__, __FILE__,
                    MSG_ARK_ERR_FAILS, ark_mem->tcur, ark_mem->h);
    break;
  case ARK_CONV_FAILURE:
    arkProcessError(ark_mem, ARK_CONV_FAILURE, __LINE__, __func__, __FILE__,
                    MSG_ARK_CONV_FAILS, ark_mem->tcur, ark_mem->h);
    break;
  case ARK_LSETUP_FAIL:
    arkProcessError(ark_mem, ARK_LSETUP_FAIL, __LINE__, __func__, __FILE__,
                    MSG_ARK_SETUP_FAILED, ark_mem->tcur);
    break;
  case ARK_LSOLVE_FAIL:
    arkProcessError(ark_mem, ARK_LSOLVE_FAIL, __LINE__, __func__, __FILE__,
                    MSG_ARK_SOLVE_FAILED, ark_mem->tcur);
    break;
  case ARK_RHSFUNC_FAIL:
    arkProcessError(ark_mem, ARK_RHSFUNC_FAIL, __LINE__, __func__, __FILE__,
                    MSG_ARK_RHSFUNC_FAILED, ark_mem->tcur);
    break;
  case ARK_UNREC_RHSFUNC_ERR:
    arkProcessError(ark_mem, ARK_UNREC_RHSFUNC_ERR, __LINE__, __func__,
                    __FILE__, MSG_ARK_RHSFUNC_UNREC, ark_mem->tcur);
    break;
  case ARK_REPTD_RHSFUNC_ERR:
    arkProcessError(ark_mem, ARK_REPTD_RHSFUNC_ERR, __LINE__, __func__,
                    __FILE__, MSG_ARK_RHSFUNC_REPTD, ark_mem->tcur);
    break;
  case ARK_RTFUNC_FAIL:
    arkProcessError(ark_mem, ARK_RTFUNC_FAIL, __LINE__, __func__, __FILE__,
                    MSG_ARK_RTFUNC_FAILED, ark_mem->tcur);
    break;
  case ARK_TOO_CLOSE:
    arkProcessError(ark_mem, ARK_TOO_CLOSE, __LINE__, __func__, __FILE__,
                    MSG_ARK_TOO_CLOSE);
    break;
  case ARK_CONSTR_FAIL:
    arkProcessError(ark_mem, ARK_CONSTR_FAIL, __LINE__, __func__, __FILE__,
                    MSG_ARK_FAILED_CONSTR, ark_mem->tcur);
    break;
  case ARK_MASSSOLVE_FAIL:
    arkProcessError(ark_mem, ARK_MASSSOLVE_FAIL, __LINE__, __func__, __FILE__,
                    MSG_ARK_MASSSOLVE_FAIL);
    break;
  case ARK_NLS_SETUP_FAIL:
    arkProcessError(ark_mem, ARK_NLS_SETUP_FAIL, __LINE__, __func__, __FILE__,
                    "At t = " SUN_FORMAT_G
                    " the nonlinear solver setup failed unrecoverably",
                    ark_mem->tcur);
    break;
  case ARK_VECTOROP_ERR:
    arkProcessError(ark_mem, ARK_VECTOROP_ERR, __LINE__, __func__, __FILE__,
                    MSG_ARK_VECTOROP_ERR, ark_mem->tcur);
    break;
  case ARK_INNERSTEP_FAIL:
    arkProcessError(ark_mem, ARK_INNERSTEP_FAIL, __LINE__, __func__, __FILE__,
                    MSG_ARK_INNERSTEP_FAILED, ark_mem->tcur);
    break;
  case ARK_NLS_OP_ERR:
    arkProcessError(ark_mem, ARK_NLS_OP_ERR, __LINE__, __func__, __FILE__,
                    MSG_ARK_NLS_FAIL, ark_mem->tcur);
    break;
  case ARK_USER_PREDICT_FAIL:
    arkProcessError(ark_mem, ARK_USER_PREDICT_FAIL, __LINE__, __func__,
                    __FILE__, MSG_ARK_USER_PREDICT_FAIL, ark_mem->tcur);
    break;
  case ARK_POSTPROCESS_STEP_FAIL:
    arkProcessError(ark_mem, ARK_POSTPROCESS_STEP_FAIL, __LINE__, __func__,
                    __FILE__, MSG_ARK_POSTPROCESS_STEP_FAIL, ark_mem->tcur);
    break;
  case ARK_POSTPROCESS_STAGE_FAIL:
    arkProcessError(ark_mem, ARK_POSTPROCESS_STAGE_FAIL, __LINE__, __func__,
                    __FILE__, MSG_ARK_POSTPROCESS_STAGE_FAIL, ark_mem->tcur);
    break;
  case ARK_INTERP_FAIL:
    arkProcessError(ark_mem, ARK_INTERP_FAIL, __LINE__, __func__, __FILE__,
                    "At t = " SUN_FORMAT_G
                    " the interpolation module failed unrecoverably",
                    ark_mem->tcur);
    break;
  case ARK_INVALID_TABLE:
    arkProcessError(ark_mem, ARK_INVALID_TABLE, __LINE__, __func__, __FILE__,
                    "ARKODE was provided an invalid method table");
    break;
  case ARK_RELAX_FAIL:
    arkProcessError(ark_mem, ARK_RELAX_FAIL, __LINE__, __func__, __FILE__,
                    "At t = " SUN_FORMAT_G " the relaxation module failed",
                    ark_mem->tcur);
    break;
  case ARK_RELAX_MEM_NULL:
    arkProcessError(ark_mem, ARK_RELAX_MEM_NULL, __LINE__, __func__, __FILE__,
                    "The ARKODE relaxation module memory is NULL");
    break;
  case ARK_RELAX_FUNC_FAIL:
    arkProcessError(ark_mem, ARK_RELAX_FUNC_FAIL, __LINE__, __func__, __FILE__,
                    "The relaxation function failed unrecoverably");
    break;
  case ARK_RELAX_JAC_FAIL:
    arkProcessError(ark_mem, ARK_RELAX_JAC_FAIL, __LINE__, __func__, __FILE__,
                    "The relaxation Jacobian failed unrecoverably");
    break;
  case ARK_ADJ_RECOMPUTE_FAIL:
    arkProcessError(ark_mem, ARK_ADJ_RECOMPUTE_FAIL, __LINE__, __func__, __FILE__,
                    "The forward recomputation of step failed unrecoverably");
    break;
  case ARK_ADJ_CHECKPOINT_FAIL:
    arkProcessError(ark_mem, ARK_ADJ_CHECKPOINT_FAIL, __LINE__, __func__,
                    __FILE__, "A checkpoint operation failed unrecoverably");
    break;
  case ARK_SUNADJSTEPPER_ERR:
    arkProcessError(ark_mem, ARK_SUNADJSTEPPER_ERR, __LINE__, __func__,
                    __FILE__, "A SUNAdjStepper operation failed unrecoverably");
    break;
  case ARK_DOMEIG_FAIL:
    arkProcessError(ark_mem, ARK_DOMEIG_FAIL, __LINE__, __func__, __FILE__,
                    "The dominant eigenvalue function failed unrecoverably");
    break;
  case ARK_MAX_STAGE_LIMIT_FAIL:
    arkProcessError(ark_mem, ARK_MAX_STAGE_LIMIT_FAIL, __LINE__, __func__,
                    __FILE__, "The max stage limit failed unrecoverably");
    break;
  case ARK_SUNSTEPPER_ERR:
    arkProcessError(ark_mem, ARK_SUNSTEPPER_ERR, __LINE__, __func__, __FILE__,
                    "An inner SUNStepper error occurred");
    break;
  default:
    /* This return should never happen */
    arkProcessError(ark_mem, ARK_UNRECOGNIZED_ERROR, __LINE__, __func__, __FILE__,
                    "ARKODE encountered an unrecognized error. Please report "
                    "this to the Sundials developers at "
                    "sundials-users@llnl.gov");
    return (ARK_UNRECOGNIZED_ERROR);
  }

  return (flag);
}